

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL12_compat.c
# Opt level: O1

int SDL_CDPlayTracks(SDL12_CD *cdrom,int start_track,int start_frame,int ntracks,int nframes)

{
  int iVar1;
  char *pcVar2;
  
  if (CDRomInit == '\x01') {
    if ((cdrom == (SDL12_CD *)0x0) && (cdrom = CDRomDevice, CDRomDevice == (SDL12_CD *)0x0)) {
      pcVar2 = "CD-ROM not opened";
      goto LAB_00112421;
    }
  }
  else {
    pcVar2 = "CD-ROM subsystem not initialized";
LAB_00112421:
    cdrom = (SDL12_CD *)0x0;
    (*SDL20_SetError)(pcVar2);
  }
  if (cdrom == (SDL12_CD *)0x0) {
    return -1;
  }
  if (cdrom->status == SDL12_CD_TRAYEMPTY) {
    pcVar2 = "Tray empty";
  }
  else {
    if (-1 < start_track) {
      iVar1 = cdrom->numtracks;
      if (iVar1 - start_track != 0 && start_track <= iVar1) {
        if ((start_frame < 0) || (cdrom->track[(uint)start_track].length <= (uint)start_frame)) {
          pcVar2 = "Invalid start frame";
        }
        else if ((ntracks < 0) || (iVar1 <= ntracks + start_track)) {
          pcVar2 = "Invalid number of tracks";
        }
        else {
          if ((-1 < nframes) && ((uint)nframes < cdrom->track[(uint)(ntracks + start_track)].length)
             ) {
            if (nframes == 0 && ntracks == 0) {
              nframes = cdrom->track[iVar1 - 1].length;
              ntracks = iVar1 - start_track;
            }
            iVar1 = StartCDAudioPlaying(cdrom,start_track,start_frame,ntracks,nframes);
            return iVar1;
          }
          pcVar2 = "Invalid number of frames";
        }
        goto LAB_0011252a;
      }
    }
    pcVar2 = "Invalid start track";
  }
LAB_0011252a:
  iVar1 = (*SDL20_SetError)(pcVar2);
  return iVar1;
}

Assistant:

SDLCALL
SDL_CDPlayTracks(SDL12_CD *cdrom, int start_track, int start_frame, int ntracks, int nframes)
{
    if ((cdrom = ValidCDDevice(cdrom)) == NULL) {
        return -1;
    }
    if (cdrom->status == SDL12_CD_TRAYEMPTY) {
        return SDL20_SetError("Tray empty");
    }
    if ((start_track < 0) || (start_track >= cdrom->numtracks)) {
        return SDL20_SetError("Invalid start track");
    }
    if ((start_frame < 0) || (((Uint32) start_frame) >= cdrom->track[start_track].length)) {
        return SDL20_SetError("Invalid start frame");
    }
    if ((ntracks < 0) || ((start_track + ntracks) >= cdrom->numtracks)) {
        return SDL20_SetError("Invalid number of tracks");
    }
    if ((nframes < 0) || (((Uint32) nframes) >= cdrom->track[start_track + ntracks].length)) {
        return SDL20_SetError("Invalid number of frames");
    }

    if (!ntracks && !nframes) {
        ntracks = cdrom->numtracks - start_track;
        nframes = cdrom->track[cdrom->numtracks - 1].length;
    }

    return StartCDAudioPlaying(cdrom, start_track, start_frame, ntracks, nframes);
}